

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcreteVisitor.hh
# Opt level: O3

shared_ptr<VisitorResult> __thiscall ConcreteVisitor::visit(ConcreteVisitor *this,ASTWhere *where)

{
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<VisitorResult> sVar2;
  shared_ptr<LogicalOperation> lop;
  undefined1 local_39;
  ASTVisitor local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  shared_ptr<LogicalOperation> local_20;
  
  (**(code **)**(undefined8 **)(in_RDX + 8))(&local_38,*(undefined8 **)(in_RDX + 8),where);
  local_20.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38._vptr_ASTVisitor;
  local_20.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_30[0]._M_pi;
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_30[0]._M_pi)->_M_use_count = (a_Stack_30[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (a_Stack_30[0]._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_00102ddd;
    }
    else {
      (a_Stack_30[0]._M_pi)->_M_use_count = (a_Stack_30[0]._M_pi)->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
LAB_00102ddd:
  local_38._vptr_ASTVisitor = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<LogicalFilter,std::allocator<LogicalFilter>,std::shared_ptr<LogicalOperation>&>
            (a_Stack_30,(LogicalFilter **)&local_38,(allocator<LogicalFilter> *)&local_39,&local_20)
  ;
  (this->super_ASTVisitor)._vptr_ASTVisitor = local_38._vptr_ASTVisitor;
  this[1].super_ASTVisitor._vptr_ASTVisitor = (_func_int **)a_Stack_30[0]._M_pi;
  _Var1._M_pi = extraout_RDX;
  if (local_20.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<VisitorResult>)
         sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VisitorResult> visit(ASTWhere *where) override {
        auto lop = std::static_pointer_cast<LogicalOperation>(where->getFilterOperation()->accept(this));
        return std::make_shared<LogicalFilter>(lop);
    }